

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int flatcc_builder_default_alloc
              (void *alloc_context,flatcc_iovec_t *b,size_t request,int zero_fill,int hint)

{
  ulong uVar1;
  ulong __size;
  void *pvVar2;
  int iVar3;
  
  if (request == 0) {
    iVar3 = 0;
    if (b->iov_base != (void *)0x0) {
      free(b->iov_base);
      b->iov_base = (void *)0x0;
      b->iov_len = 0;
    }
  }
  else {
    switch(hint) {
    case 1:
      uVar1 = 0x100;
      break;
    default:
      uVar1 = 0x20;
      break;
    case 4:
      uVar1 = 0x120;
      break;
    case 5:
      uVar1 = request;
      break;
    case 7:
      uVar1 = 0x40;
    }
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < request);
    iVar3 = 0;
    if (b->iov_len < request || b->iov_len >> 1 < __size) {
      pvVar2 = realloc(b->iov_base,__size);
      if (pvVar2 == (void *)0x0) {
        iVar3 = -1;
      }
      else {
        if (zero_fill != 0) {
          uVar1 = b->iov_len;
          if (uVar1 <= __size && __size - uVar1 != 0) {
            memset((void *)((long)pvVar2 + uVar1),0,__size - uVar1);
          }
        }
        b->iov_base = pvVar2;
        b->iov_len = __size;
      }
    }
  }
  return iVar3;
}

Assistant:

int flatcc_builder_default_alloc(void *alloc_context, iovec_t *b, size_t request, int zero_fill, int hint)
{
    void *p;
    size_t n;

    (void)alloc_context;

    if (request == 0) {
        if (b->iov_base) {
            FLATCC_BUILDER_FREE(b->iov_base);
            b->iov_base = 0;
            b->iov_len = 0;
        }
        return 0;
    }
    switch (hint) {
    case flatcc_builder_alloc_ds:
        n = 256;
        break;
    case flatcc_builder_alloc_ht:
        /* Should be exact size, or space size is just wasted. */
        n = request;
        break;
    case flatcc_builder_alloc_fs:
        n = sizeof(__flatcc_builder_frame_t) * 8;
        break;
    case flatcc_builder_alloc_us:
        n = 64;
        break;
    default:
        /*
         * We have many small structures - vs stack for tables with few
         * elements, and few offset fields in patch log. No need to
         * overallocate in case of busy small messages.
         */
        n = 32;
        break;
    }
    while (n < request) {
        n *= 2;
    }
    if (request <= b->iov_len && b->iov_len / 2 >= n) {
        /* Add hysteresis to shrink. */
        return 0;
    }
    if (!(p = FLATCC_BUILDER_REALLOC(b->iov_base, n))) {
        return -1;
    }
    /* Realloc might also shrink. */
    if (zero_fill && b->iov_len < n) {
        memset((uint8_t *)p + b->iov_len, 0, n - b->iov_len);
    }
    b->iov_base = p;
    b->iov_len = n;
    return 0;
}